

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall
CTcTokenizer::CTcTokenizer(CTcTokenizer *this,CResLoader *res_loader,char *default_charset)

{
  CTcMacroTable *pCVar1;
  textchar_t *str;
  char *pcVar2;
  CCharmapToUni *pCVar3;
  CTcBasicMacroTable *this_00;
  CVmHashFunc *pCVar4;
  CVmHashTable *pCVar5;
  CTcHashEntryPpLINE *this_01;
  CTcHashEntryPpFILE *this_02;
  tm *__tp;
  CTcMacroRsc *pCVar6;
  CVmHashEntry *entry;
  CTcMacroRsc *pCVar7;
  kwdef *pkVar8;
  int iVar9;
  bool bVar10;
  time_t timer;
  char timebuf [50];
  
  (this->p_).p_ = (char *)0x0;
  (this->linebuf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00316898;
  (this->linebuf_).buf_len_ = 0;
  (this->linebuf_).buf_ = (char *)0x0;
  (this->linebuf_).buf_size_ = 0;
  (this->unsplicebuf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00316898;
  (this->unsplicebuf_).buf_ = (char *)0x0;
  (this->unsplicebuf_).buf_size_ = 0;
  (this->unsplicebuf_).buf_len_ = 0;
  (this->expbuf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00316898;
  (this->expbuf_).buf_ = (char *)0x0;
  (this->expbuf_).buf_size_ = 0;
  (this->expbuf_).buf_len_ = 0;
  (this->defbuf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00316898;
  (this->defbuf_).buf_len_ = 0;
  (this->defbuf_).buf_ = (char *)0x0;
  (this->defbuf_).buf_size_ = 0;
  (this->comment_in_embedding_).level = 0;
  (this->comment_in_embedding_).s = (tok_embed_level *)0x0;
  (this->macro_in_embedding_).level = 0;
  (this->macro_in_embedding_).s = (tok_embed_level *)0x0;
  (this->main_in_embedding_).level = 0;
  (this->main_in_embedding_).s = (tok_embed_level *)0x0;
  this->res_loader_ = res_loader;
  this->ext_src_ = (CTcTokenSource *)0x0;
  this->str_ = (CTcTokStream *)0x0;
  this->desc_head_ = (CTcTokFileDesc *)0x0;
  this->desc_tail_ = (CTcTokFileDesc *)0x0;
  this->desc_list_ = (CTcTokFileDesc **)0x0;
  this->desc_list_cnt_ = 0;
  this->desc_list_alo_ = 0;
  this->next_filedesc_id_ = 0;
  clear_linebuf(this);
  CTcTokString::ensure_space(&this->linebuf_,0x1000);
  CTcTokString::ensure_space(&this->expbuf_,0x1000);
  this->curbuf_ = &this->linebuf_;
  (this->p_).p_ = (this->linebuf_).buf_;
  pcVar2 = lib_copy_str(default_charset);
  this->default_charset_ = pcVar2;
  this->default_mapper_ = (CCharmapToUni *)0x0;
  if (default_charset != (char *)0x0) {
    pCVar3 = CCharmapToUni::load(res_loader,default_charset);
    this->default_mapper_ = pCVar3;
    if (pCVar3 != (CCharmapToUni *)0x0) goto LAB_00216a98;
  }
  pCVar3 = (CCharmapToUni *)operator_new(0x210);
  memset(pCVar3,0,0x210);
  (pCVar3->super_CCharmap).ref_cnt_ = 1;
  (pCVar3->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_003040d8;
  this->default_mapper_ = pCVar3;
LAB_00216a98:
  this->allow_pp_ = 1;
  this->prev_includes_ = (tctok_incfile_t *)0x0;
  this->string_newline_spacing_ = NEWLINE_SPACING_COLLAPSE;
  this->in_quote_ = L'\0';
  this->in_triple_ = 0;
  this->if_sp_ = 0;
  this->if_false_level_ = 0;
  this->incpath_head_ = (tctok_incpath_t *)0x0;
  this->incpath_tail_ = (tctok_incpath_t *)0x0;
  *(byte *)this = *(byte *)this & 0xc0;
  this->last_desc_ = (CTcTokFileDesc *)0x0;
  this->last_linenum_ = 0;
  this->appended_desc_ = (CTcTokFileDesc *)0x0;
  this->appended_linenum_ = 0;
  init_src_block_list(this);
  this_00 = (CTcBasicMacroTable *)operator_new(0x28);
  pCVar4 = (CVmHashFunc *)operator_new(8);
  pCVar4->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0031c898;
  CTcBasicMacroTable::CTcBasicMacroTable(this_00,0x200,pCVar4,1);
  this->defines_ = (CTcMacroTable *)this_00;
  pCVar5 = (CVmHashTable *)operator_new(0x20);
  pCVar4 = (CVmHashFunc *)operator_new(8);
  pCVar4->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0031c898;
  CVmHashTable::CVmHashTable(pCVar5,0x40,pCVar4,1);
  this->undefs_ = pCVar5;
  pCVar1 = this->defines_;
  this_01 = (CTcHashEntryPpLINE *)operator_new(0x50);
  CTcHashEntryPpLINE::CTcHashEntryPpLINE(this_01,this);
  (*pCVar1->_vptr_CTcMacroTable[2])(pCVar1,this_01);
  pCVar1 = this->defines_;
  this_02 = (CTcHashEntryPpFILE *)operator_new(0x50);
  CTcHashEntryPpFILE::CTcHashEntryPpFILE(this_02,this);
  (*pCVar1->_vptr_CTcMacroTable[2])(pCVar1,this_02);
  timer = time((time_t *)0x0);
  __tp = localtime(&timer);
  pcVar2 = asctime(__tp);
  sprintf(timebuf,"\'%.3s %2d %4d\'",pcVar2 + 4,(ulong)(uint)__tp->tm_mday,
          (ulong)(__tp->tm_year + 0x76c));
  add_define(this,"__DATE__",timebuf);
  sprintf(timebuf,"\'%.8s\'",pcVar2 + 0xb);
  add_define(this,"__TIME__",timebuf);
  this->macro_res_head_ = (CTcMacroRsc *)0x0;
  this->macro_res_avail_ = (CTcMacroRsc *)0x0;
  iVar9 = 7;
  pCVar7 = (CTcMacroRsc *)0x0;
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    pCVar6 = (CTcMacroRsc *)operator_new(0x70);
    (pCVar6->line_exp_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00316898;
    (pCVar6->line_exp_).buf_ = (char *)0x0;
    (pCVar6->line_exp_).buf_size_ = 0;
    (pCVar6->line_exp_).buf_len_ = 0;
    (pCVar6->macro_exp_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00316898;
    (pCVar6->macro_exp_).buf_len_ = 0;
    (pCVar6->macro_exp_).buf_ = (char *)0x0;
    (pCVar6->macro_exp_).buf_size_ = 0;
    (pCVar6->actual_exp_buf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00316898;
    (pCVar6->actual_exp_buf_).buf_ = (char *)0x0;
    (pCVar6->actual_exp_buf_).buf_size_ = 0;
    (pCVar6->actual_exp_buf_).buf_len_ = 0;
    pCVar6->next_ = pCVar7;
    this->macro_res_head_ = pCVar6;
    pCVar6->next_avail_ = pCVar7;
    this->macro_res_avail_ = pCVar6;
    pCVar7 = pCVar6;
  }
  pCVar5 = (CVmHashTable *)operator_new(0x20);
  pCVar4 = (CVmHashFunc *)operator_new(8);
  pCVar4->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0031c898;
  CVmHashTable::CVmHashTable(pCVar5,0x40,pCVar4,1);
  this->kw_ = pCVar5;
  for (pkVar8 = CTcTokenizer::kwlist; str = pkVar8->kw_text, str != (textchar_t *)0x0;
      pkVar8 = pkVar8 + 1) {
    pCVar5 = this->kw_;
    entry = (CVmHashEntry *)operator_new(0x28);
    CTcHashEntryKw::CTcHashEntryKw((CTcHashEntryKw *)entry,str,pkVar8->kw_tok_id);
    CVmHashTable::add(pCVar5,entry);
  }
  this->unget_head_ = (CTcTokenEle *)0x0;
  this->unget_cur_ = (CTcTokenEle *)0x0;
  this->string_fp_ = (CVmDataSource *)0x0;
  this->string_fp_map_ = (CCharmapToLocal *)0x0;
  (this->curtok_).typ_ = TOKT_NULLTOK;
  (this->curtok_).text_ = "<Start of Input>";
  (this->curtok_).text_len_ = 0x10;
  return;
}

Assistant:

CTcTokenizer::CTcTokenizer(CResLoader *res_loader,
                           const char *default_charset)
{
    int i;
    os_time_t timer;
    struct tm *tblk;
    const char *tstr;
    char timebuf[50];
    struct kwdef
    {
        const char *kw_text;
        tc_toktyp_t kw_tok_id;
    };
    static const kwdef kwlist[] =
    {
        { "self", TOKT_SELF },
        { "targetprop", TOKT_TARGETPROP },
        { "targetobj", TOKT_TARGETOBJ },
        { "definingobj", TOKT_DEFININGOBJ },
        { "inherited", TOKT_INHERITED },
        { "delegated", TOKT_DELEGATED },
        { "argcount", TOKT_ARGCOUNT },
        { "if", TOKT_IF },
        { "else", TOKT_ELSE },
        { "for", TOKT_FOR },
        { "while", TOKT_WHILE },
        { "do", TOKT_DO },
        { "switch", TOKT_SWITCH },
        { "case", TOKT_CASE },
        { "default", TOKT_DEFAULT },
        { "goto", TOKT_GOTO },
        { "break", TOKT_BREAK },
        { "continue", TOKT_CONTINUE },
//      { "and", TOKT_AND },
//      { "or", TOKT_OR },
//      { "not", TOKT_NOT },
        { "function", TOKT_FUNCTION },
        { "return", TOKT_RETURN },
        { "local", TOKT_LOCAL },
        { "object", TOKT_OBJECT },
        { "nil", TOKT_NIL },
        { "true", TOKT_TRUE },
        { "pass", TOKT_PASS },
        { "external", TOKT_EXTERNAL },
        { "extern", TOKT_EXTERN },
        { "formatstring", TOKT_FORMATSTRING },
        { "class", TOKT_CLASS },
        { "replace", TOKT_REPLACE },
        { "modify", TOKT_MODIFY },
        { "new", TOKT_NEW },
//      { "delete", TOKT_DELETE },
        { "throw", TOKT_THROW },
        { "try", TOKT_TRY },
        { "catch", TOKT_CATCH },
        { "finally", TOKT_FINALLY },
        { "intrinsic", TOKT_INTRINSIC },
        { "dictionary", TOKT_DICTIONARY },
        { "grammar", TOKT_GRAMMAR },
        { "enum", TOKT_ENUM },
        { "template", TOKT_TEMPLATE },
        { "static", TOKT_STATIC },
        { "foreach", TOKT_FOREACH },
        { "export", TOKT_EXPORT },
        { "propertyset", TOKT_PROPERTYSET },
        { "transient", TOKT_TRANSIENT },
        { "replaced", TOKT_REPLACED },
        { "property", TOKT_PROPERTY },
        { "operator", TOKT_OPERATOR },
        { "method", TOKT_METHOD },
        { "invokee", TOKT_INVOKEE },

//      { "void", TOKT_VOID },
//      { "int", TOKT_INT },
//      { "string", TOKT_STRING },
//      { "list", TOKT_LIST },
//      { "boolean", TOKT_BOOLEAN },
//      { "any", TOKT_ANY },

        /* end-of-table marker */
        { 0, TOKT_INVALID }
    };
    const kwdef *kwp;
    
    /* remember my resource loader */
    res_loader_ = res_loader;

    /* there's no stream yet */
    str_ = 0;

    /* no external source yet */
    ext_src_ = 0;

    /* start numbering the file descriptors at zero */
    next_filedesc_id_ = 0;

    /* there are no file descriptors yet */
    desc_head_ = 0;
    desc_tail_ = 0;
    desc_list_ = 0;
    desc_list_cnt_ = desc_list_alo_ = 0;

    /* empty out the input line buffer */
    clear_linebuf();

    /* start out with a minimal line buffer size */
    linebuf_.ensure_space(4096);
    expbuf_.ensure_space(4096);

    /* set up at the beginning of the input line buffer */
    start_new_line(&linebuf_, 0);

    /* remember the default character set */
    default_charset_ = lib_copy_str(default_charset);

    /* we don't have a default character mapper yet */
    default_mapper_ = 0;

    /* create an input mapper for the default character set, if specified */
    if (default_charset != 0)
        default_mapper_ = CCharmapToUni::load(res_loader, default_charset);

    /* 
     *   if the default character set wasn't specified, or we failed to
     *   load a mapper for the specified character set, use a plain ASCII
     *   mapper 
     */
    if (default_mapper_ == 0)
        default_mapper_ = new CCharmapToUniASCII();

    /* presume we're not in preprocessor-only mode */
    pp_only_mode_ = FALSE;

    /* presume we're not in list-includes mode */
    list_includes_mode_ = FALSE;

    /* presume we're not in test report mode */
    test_report_mode_ = FALSE;

    /* allow preprocessing directives */
    allow_pp_ = TRUE;

    /* there are no previously-included files yet */
    prev_includes_ = 0;

    /* by default, use the "collapse" mode for newlines in strings */
    string_newline_spacing_ = NEWLINE_SPACING_COLLAPSE;

    /* start out with ALL_ONCE mode off */
    all_once_ = FALSE;

    /* by default, ignore redundant includes without warning */
    warn_on_ignore_incl_ = FALSE;

    /* there are no include path entries yet */
    incpath_head_ = incpath_tail_ = 0;

    /* not in a quoted string yet */
    in_quote_ = '\0';
    in_triple_ = FALSE;

    /* not in a #if block yet */
    if_sp_ = 0;
    if_false_level_ = 0;

    /* not processing a preprocessor constant expression */
    in_pp_expr_ = FALSE;

    /* we don't have a current or appended line yet */
    last_desc_ = 0;
    last_linenum_ = 0;
    appended_desc_ = 0;
    appended_linenum_ = 0;

    /* allocate the first token-list block */
    init_src_block_list();

    /* create the #define and #undef symbol tables */
    defines_ = new CTcBasicMacroTable(512, new CVmHashFuncCS(), TRUE);
    undefs_ = new CVmHashTable(64, new CVmHashFuncCS(), TRUE);

    /* create the special __LINE__ and __FILE__ macros */
    defines_->add(new CTcHashEntryPpLINE(this));
    defines_->add(new CTcHashEntryPpFILE(this));

    /* get the current time and date */
    timer = os_time(0);
    tblk = os_localtime(&timer);
    tstr = asctime(tblk);

    /* 
     *   add the __DATE__ macro - the format is "Mmm dd yyyy", where "Mmm"
     *   is the three-letter month name generated by asctime(), "dd" is
     *   the day of the month, with a leading space for numbers less than
     *   ten, and "yyyy" is the year. 
     */
    sprintf(timebuf, "'%.3s %2d %4d'",
            tstr + 4, tblk->tm_mday, tblk->tm_year + 1900);
    add_define("__DATE__", timebuf);

    /* add the __TIME__ macro - 24-hour "hh:mm:ss" format */
    sprintf(timebuf, "'%.8s'", tstr + 11);
    add_define("__TIME__", timebuf);

    /* 
     *   Allocate a pool of macro resources.  The number we start with is
     *   arbitrary, since we'll add more as needed, but we want to try to
     *   allocate enough up front that we avoid time-consuming memory
     *   allocations later.  On the other hand, we don't want to
     *   pre-allocate a huge number of objects that we'll never use.  
     */
    for (macro_res_avail_ = 0, macro_res_head_ = 0, i = 0 ; i < 7 ; ++i)
    {
        CTcMacroRsc *rsc;
        
        /* allocate a new object */
        rsc = new CTcMacroRsc();

        /* add it onto the master list */
        rsc->next_ = macro_res_head_;
        macro_res_head_ = rsc;

        /* add it onto the available list */
        rsc->next_avail_ = macro_res_avail_;
        macro_res_avail_ = rsc;
    }

    /* create the keyword hash table */
    kw_ = new CVmHashTable(64, new CVmHashFuncCS(), TRUE);

    /* populate the keyword table */
    for (kwp = kwlist ; kwp->kw_text != 0 ; ++kwp)
        kw_->add(new CTcHashEntryKw(kwp->kw_text, kwp->kw_tok_id));

    /* no ungot tokens yet */
    unget_head_ = unget_cur_ = 0;

    /* no string capture file */
    string_fp_ = 0;
    string_fp_map_ = 0;

    /* there's no current token yet */
    curtok_.settyp(TOKT_NULLTOK);
    curtok_.set_text("<Start of Input>", 16);
}